

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void main_parse_loop(vw *all)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = thread_dispatch;
  local_10 = std::
             _Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>
             ::_M_manager;
  parse_dispatch(all,(dispatch_fptr *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

void main_parse_loop(vw* all) { parse_dispatch(*all, thread_dispatch); }